

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::JsonClassBase<cfd::api::json::DecodeRawTransactionRequest>::DeserializeUniValue
          (JsonClassBase<cfd::api::json::DecodeRawTransactionRequest> *this,UniValue *value)

{
  bool bVar1;
  size_type sVar2;
  pointer ppVar3;
  iterator __args;
  iterator __args_1;
  UniValue *in_RSI;
  long *in_RDI;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> *table_info_1;
  iterator iter_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  *child;
  iterator __end3;
  iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  *__range3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  json_map;
  JsonTableMap<cfd::api::json::DecodeRawTransactionRequest> mapper;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> *table_info;
  iterator iter;
  JsonTableMap<cfd::api::json::DecodeRawTransactionRequest> mapper_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>_>
  *in_stack_fffffffffffffec8;
  UniValue *in_stack_fffffffffffffed0;
  DecodeRawTransactionRequest *in_stack_fffffffffffffed8;
  function<void_(cfd::api::json::DecodeRawTransactionRequest_&,_const_UniValue_&)>
  *in_stack_fffffffffffffee0;
  function<void_(cfd::api::json::DecodeRawTransactionRequest_&,_const_UniValue_&)> *this_00;
  _Self local_f8;
  _Self local_f0;
  reference local_e8;
  _Self local_e0;
  _Self local_d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  *local_d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  local_c8 [2];
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> *local_68;
  _Self local_60;
  _Self local_58 [9];
  UniValue *local_10;
  
  local_10 = in_RSI;
  bVar1 = UniValue::isArray(in_RSI);
  if (bVar1) {
    (**(code **)(*in_RDI + 0x48))();
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>_>
           *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    sVar2 = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>_>
            ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>_>
                    *)0x640fe2);
    if (sVar2 == 1) {
      (**(code **)(*in_RDI + 0x20))();
      local_58[0]._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>_>
           ::begin(in_stack_fffffffffffffec8);
      local_60._M_node =
           (_Base_ptr)
           ::std::
           end<std::map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>>>>
                     (in_stack_fffffffffffffec8);
      bVar1 = ::std::operator!=(local_58,&local_60);
      if (bVar1) {
        ppVar3 = ::std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>
                               *)0x64105c);
        local_68 = &ppVar3->second;
        ::std::function<void_(cfd::api::json::DecodeRawTransactionRequest_&,_const_UniValue_&)>::
        operator()(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      }
      (**(code **)(*in_RDI + 0x28))();
    }
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>_>
            *)0x6410cf);
  }
  else {
    bVar1 = UniValue::isObject(local_10);
    if (bVar1) {
      (**(code **)(*in_RDI + 0x20))();
      (**(code **)(*in_RDI + 0x48))();
      ::std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>_>
             *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      this_00 = (function<void_(cfd::api::json::DecodeRawTransactionRequest_&,_const_UniValue_&)> *)
                local_c8;
      ::std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)this_00);
      UniValue::getObjMap(local_10,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                                    *)this_00);
      local_d0 = local_c8;
      local_d8._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
           ::begin(local_d0);
      local_e0._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
           ::end(local_d0);
      while (bVar1 = ::std::operator!=(&local_d8,&local_e0), bVar1) {
        local_e8 = ::std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                   ::operator*(&local_d8);
        __args = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>_>
                 ::find(in_stack_fffffffffffffec8,(key_type *)0x64119c);
        local_f0._M_node = __args._M_node;
        __args_1 = ::std::
                   end<std::map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>>>>
                             (in_stack_fffffffffffffec8);
        local_f8._M_node = __args_1._M_node;
        bVar1 = ::std::operator!=(&local_f0,&local_f8);
        if (bVar1) {
          ::std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>
                        *)0x6411ea);
          ::std::function<void_(cfd::api::json::DecodeRawTransactionRequest_&,_const_UniValue_&)>::
          operator()(this_00,(DecodeRawTransactionRequest *)__args._M_node,
                     (UniValue *)__args_1._M_node);
        }
        ::std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
        ::operator++(&local_d8);
      }
      (**(code **)(*in_RDI + 0x28))();
      ::std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
      ::~map(local_c8);
      ::std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>_>_>_>
              *)0x641278);
    }
  }
  return;
}

Assistant:

virtual void DeserializeUniValue(const UniValue& value) {
    if (value.isArray()) {
      // If root is one list, take over to child class
      JsonTableMap<TYPE> mapper = GetJsonMapper();
      if (mapper.size() == 1) {
        PreDeserialize();
        auto iter = mapper.begin();
        if (iter != end(mapper)) {
          CLASS_FUNCTION_TABLE<TYPE>* table_info = &iter->second;
          table_info->set_function(*(reinterpret_cast<TYPE*>(this)), value);
        }
        PostDeserialize();
      }
      return;
    } else if (!value.isObject()) {
      return;
    }
    PreDeserialize();
    JsonTableMap<TYPE> mapper = GetJsonMapper();
    std::map<std::string, UniValue> json_map;
    value.getObjMap(json_map);
    for (const auto& child : json_map) {
      auto iter = mapper.find(child.first);
      if (iter != end(mapper)) {
        CLASS_FUNCTION_TABLE<TYPE>* table_info = &iter->second;
        table_info->set_function(
            *(reinterpret_cast<TYPE*>(this)), child.second);
      }
    }
    PostDeserialize();
  }